

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_read.c
# Opt level: O2

int TIFFStartStrip(TIFF *tif,uint32_t strip)

{
  uint uVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar5 = tif->tif_flags;
  if ((uVar5 & 0x20) == 0) {
    iVar2 = (*tif->tif_setupdecode)(tif);
    if (iVar2 == 0) {
      return 0;
    }
    uVar5 = tif->tif_flags | 0x20;
  }
  tif->tif_curstrip = strip;
  uVar1 = (tif->tif_dir).td_stripsperimage;
  uVar4 = (ulong)uVar1;
  tif->tif_row = (strip % uVar1) * (tif->tif_dir).td_rowsperstrip;
  tif->tif_flags = uVar5 & 0xffefffff;
  if ((uVar5 >> 0x11 & 1) == 0) {
    tif->tif_rawcp = tif->tif_rawdata;
    if (tif->tif_rawdataloaded < 1) {
      uVar3 = TIFFGetStrileByteCount(tif,strip);
      tif->tif_rawcc = uVar3;
      uVar4 = (ulong)(tif->tif_dir).td_stripsperimage;
    }
    else {
      tif->tif_rawcc = tif->tif_rawdataloaded;
    }
  }
  else {
    tif->tif_rawcp = (uint8_t *)0x0;
    tif->tif_rawcc = 0;
  }
  iVar2 = (*tif->tif_predecode)(tif,(uint16_t)(strip / uVar4));
  if (iVar2 == 0) {
    tif->tif_curstrip = 0xffffffff;
  }
  return (uint)(iVar2 != 0);
}

Assistant:

static int TIFFStartStrip(TIFF *tif, uint32_t strip)
{
    TIFFDirectory *td = &tif->tif_dir;

    if ((tif->tif_flags & TIFF_CODERSETUP) == 0)
    {
        if (!(*tif->tif_setupdecode)(tif))
            return (0);
        tif->tif_flags |= TIFF_CODERSETUP;
    }
    tif->tif_curstrip = strip;
    tif->tif_row = (strip % td->td_stripsperimage) * td->td_rowsperstrip;
    tif->tif_flags &= ~TIFF_BUF4WRITE;

    if (tif->tif_flags & TIFF_NOREADRAW)
    {
        tif->tif_rawcp = NULL;
        tif->tif_rawcc = 0;
    }
    else
    {
        tif->tif_rawcp = tif->tif_rawdata;
        if (tif->tif_rawdataloaded > 0)
            tif->tif_rawcc = tif->tif_rawdataloaded;
        else
            tif->tif_rawcc = (tmsize_t)TIFFGetStrileByteCount(tif, strip);
    }
    if ((*tif->tif_predecode)(tif, (uint16_t)(strip / td->td_stripsperimage)) ==
        0)
    {
        /* Needed for example for scanline access, if tif_predecode */
        /* fails, and we try to read the same strip again. Without invalidating
         */
        /* tif_curstrip, we'd call tif_decoderow() on a possibly invalid */
        /* codec state. */
        tif->tif_curstrip = NOSTRIP;
        return 0;
    }
    return 1;
}